

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_t.cpp
# Opt level: O0

void __thiscall deci::array_t::array_t(array_t *this,array_t *copy)

{
  bool bVar1;
  int iVar2;
  size_type __n;
  reference ppvVar3;
  undefined4 extraout_var;
  value_type local_50;
  value_t *local_48;
  value_t *el;
  const_iterator __end1;
  const_iterator __begin1;
  element_t *__range1;
  array_t *copy_local;
  array_t *this_local;
  
  value_t::value_t(&this->super_value_t);
  (this->super_value_t)._vptr_value_t = (_func_int **)&PTR_DoHashing_0010ed00;
  (this->elements).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->elements).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elements).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>::vector(&this->elements);
  __n = std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>::size(&copy->elements);
  std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>::reserve(&this->elements,__n);
  __end1 = std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>::begin(&copy->elements);
  el = (value_t *)
       std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>::end(&copy->elements);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<deci::value_t_*const_*,_std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>_>
                                *)&el);
    if (!bVar1) break;
    ppvVar3 = __gnu_cxx::
              __normal_iterator<deci::value_t_*const_*,_std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>_>
              ::operator*(&__end1);
    local_48 = *ppvVar3;
    iVar2 = (*local_48->_vptr_value_t[2])();
    local_50 = (value_type)CONCAT44(extraout_var,iVar2);
    std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>::push_back
              (&this->elements,&local_50);
    __gnu_cxx::
    __normal_iterator<deci::value_t_*const_*,_std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

array_t::array_t(const array_t& copy):value_t(),elements() {
      this->elements.reserve(copy.elements.size());
      for (auto el: copy.elements) {
        this->elements.push_back(el->Copy());
      }
    }